

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
bioparser::Parser<bioparser::test::MhapOverlap>::Store
          (Parser<bioparser::test::MhapOverlap> *this,size_t count,bool strip)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  size_type sVar4;
  invalid_argument *piVar5;
  reference pvVar6;
  reference __src;
  ulong local_78;
  bool strip_local;
  size_t count_local;
  Parser<bioparser::test::MhapOverlap> *this_local;
  
  uVar1 = this->buffer_ptr_;
  sVar4 = std::vector<char,_std::allocator<char>_>::size(&this->buffer_);
  if (sVar4 < uVar1 + count) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar5,"[bioparser::Parser::Store] error: buffer overflow");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar1 = this->storage_ptr_;
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if (uVar1 + count <= (ulong)uVar2) {
    uVar1 = this->storage_ptr_;
    sVar4 = std::vector<char,_std::allocator<char>_>::size(&this->storage_);
    if (sVar4 < uVar1 + count) {
      sVar4 = std::vector<char,_std::allocator<char>_>::size(&this->storage_);
      std::vector<char,_std::allocator<char>_>::resize(&this->storage_,sVar4 << 1);
    }
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       (&this->storage_,(ulong)this->storage_ptr_);
    __src = std::vector<char,_std::allocator<char>_>::operator[]
                      (&this->buffer_,(ulong)this->buffer_ptr_);
    memcpy(pvVar6,__src,count);
    local_78 = count;
    if (strip) {
      pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&this->storage_,(ulong)this->storage_ptr_);
      uVar3 = RightStrip(pvVar6,(uint32_t)count);
      local_78 = (ulong)uVar3;
    }
    this->storage_ptr_ = this->storage_ptr_ + (int)local_78;
    this->buffer_ptr_ = this->buffer_ptr_ + (uint32_t)count + 1;
    return;
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar5,"[bioparser::Parser::Store] error: storage overflow");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Store(std::size_t count, bool strip = false) {
    if (buffer_ptr_ + count > buffer_.size()) {
      throw std::invalid_argument(
          "[bioparser::Parser::Store] error: buffer overflow");
    }
    if (storage_ptr_ + count > std::numeric_limits<std::uint32_t>::max()) {
      throw std::invalid_argument(
          "[bioparser::Parser::Store] error: storage overflow");
    }
    if (storage_ptr_ + count > storage_.size()) {
      storage_.resize(2 * storage_.size());
    }
    std::memcpy(&storage_[storage_ptr_], &buffer_[buffer_ptr_], count);
    storage_ptr_ += strip ? RightStrip(&storage_[storage_ptr_], count) : count;
    buffer_ptr_ += count + 1;  // ignore sought character
  }